

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ReReloop::create(ReReloop *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0xb8);
  memset(__s,0,0xb8);
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  *(undefined1 *)(__s + 10) = 0;
  *__s = (_func_int *)&PTR__ReReloop_01095690;
  *(undefined4 *)(__s + 0xf) = 0;
  __s[0x10] = (_func_int *)0x0;
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0xd] = (_func_int *)0x0;
  __s[0x11] = (_func_int *)(__s + 0xf);
  __s[0x12] = (_func_int *)(__s + 0xf);
  __s[0x13] = (_func_int *)0x0;
  __s[0x14] = (_func_int *)0x0;
  __s[0x15] = (_func_int *)0x0;
  __s[0x16] = (_func_int *)0x0;
  (this->super_Pass)._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<ReReloop>();
  }